

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_kv_test.cc
# Opt level: O3

void kv_set_str_key_test(btree_kv_ops *kv_ops)

{
  __suseconds_t *__s;
  _func_void_btree_ptr_void_ptr_void_ptr *p_Var1;
  long lVar2;
  int iVar3;
  size_t sVar4;
  ulong __n;
  undefined8 uStack_80;
  btree local_78;
  undefined1 local_40 [8];
  timeval __test_begin;
  char src [7];
  
  uStack_80 = 0x103706;
  gettimeofday((timeval *)local_40,(__timezone_ptr_t)0x0);
  uStack_80 = 0x10370b;
  memleak_start();
  __s = &__test_begin.tv_usec;
  __test_begin.tv_usec._4_3_ = 0x7965;
  __test_begin.tv_usec._0_4_ = 0x6b637273;
  uStack_80 = 0x103726;
  sVar4 = strlen((char *)__s);
  lVar2 = -(sVar4 + 0xf & 0xfffffffffffffff0);
  local_78.ksize = (uint8_t)sVar4;
  p_Var1 = kv_ops->set_key;
  *(undefined8 *)((long)&uStack_80 + lVar2) = 0x10374b;
  (*p_Var1)(&local_78,(void *)((long)&local_78 + lVar2),__s);
  __n = (ulong)local_78.ksize;
  *(undefined8 *)((long)&uStack_80 + lVar2) = 0x10375b;
  iVar3 = bcmp((void *)((long)&local_78 + lVar2),__s,__n);
  if (iVar3 != 0) {
    *(undefined8 *)((long)&uStack_80 + lVar2) = 0x10376f;
    kv_set_str_key_test();
  }
  *(undefined8 *)((long)&uStack_80 + lVar2) = 0x10377c;
  kv_set_str_key_test();
  return;
}

Assistant:

void kv_set_str_key_test(btree_kv_ops *kv_ops)
{
    TEST_INIT();
    memleak_start();

    btree *tree = alca(struct btree, 1);
    char src[] = "srckey";
    char *dst = alca(char, strlen(src));
    tree->ksize = strlen(src);
    kv_ops->set_key(tree, dst, src);
    TEST_CHK(!memcmp(dst, src, tree->ksize));

    memleak_end();
    TEST_RESULT("kv_set_str_key_test");
}